

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websockets.c
# Opt level: O0

void websocket_on_unwrapped
               (void *ws_p,void *msg,uint64_t len,char first,char last,char text,uchar rsv)

{
  code *pcVar1;
  void *pvVar2;
  FIOBJ FVar3;
  fio_str_info_s local_60;
  undefined8 local_48;
  uint64_t local_40;
  void *local_38;
  void *local_30;
  ws_s *ws;
  char text_local;
  char last_local;
  uint64_t uStack_20;
  char first_local;
  uint64_t len_local;
  void *msg_local;
  void *ws_p_local;
  
  local_30 = ws_p;
  ws._5_1_ = text;
  ws._6_1_ = last;
  ws._7_1_ = first;
  uStack_20 = len;
  len_local = (uint64_t)msg;
  msg_local = ws_p;
  if ((last == '\0') || (first == '\0')) {
    if (first != '\0') {
      *(char *)((long)ws_p + 0xb0) = text;
      if (*(long *)((long)ws_p + 0xa8) == 0) {
        FVar3 = fiobj_str_buf(len);
        *(FIOBJ *)((long)local_30 + 0xa8) = FVar3;
      }
      fiobj_str_resize(*(FIOBJ *)((long)local_30 + 0xa8),0);
    }
    fiobj_str_write(*(FIOBJ *)((long)local_30 + 0xa8),(char *)len_local,uStack_20);
    pvVar2 = local_30;
    if (ws._6_1_ != '\0') {
      pcVar1 = *(code **)((long)local_30 + 0x38);
      fiobj_obj2cstr(&local_60,*(FIOBJ *)((long)local_30 + 0xa8));
      (*pcVar1)(pvVar2,*(undefined1 *)((long)local_30 + 0xb0));
    }
  }
  else {
    local_48 = 0;
    local_40 = len;
    local_38 = msg;
    (**(code **)((long)ws_p + 0x38))(ws_p,text);
  }
  return;
}

Assistant:

static void websocket_on_unwrapped(void *ws_p, void *msg, uint64_t len,
                                   char first, char last, char text,
                                   unsigned char rsv) {
  ws_s *ws = ws_p;
  if (last && first) {
    ws->on_message(ws, (fio_str_info_s){.data = msg, .len = len},
                   (uint8_t)text);
    return;
  }
  if (first) {
    ws->is_text = (uint8_t)text;
    if (ws->msg == FIOBJ_INVALID)
      ws->msg = fiobj_str_buf(len);
    fiobj_str_resize(ws->msg, 0);
  }
  fiobj_str_write(ws->msg, msg, len);
  if (last) {
    ws->on_message(ws, fiobj_obj2cstr(ws->msg), ws->is_text);
  }

  (void)rsv;
}